

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_16bd48::SQLiteBuildDB::~SQLiteBuildDB(SQLiteBuildDB *this)

{
  SQLiteBuildDB *this_local;
  
  ~SQLiteBuildDB(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~SQLiteBuildDB() {
    std::lock_guard<std::mutex> guard(dbMutex);
    if (db)
      close();
  }